

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::EndColumns(void)

{
  undefined8 *puVar1;
  uint uVar2;
  ImGuiWindow *pIVar3;
  ImGuiColumnsSet *pIVar4;
  ImGuiColumnData *pIVar5;
  undefined8 uVar6;
  ImGuiContext *pIVar7;
  bool bVar8;
  int iVar9;
  ImU32 col;
  ulong uVar10;
  long lVar11;
  ImGuiID id;
  ImGuiContext *g;
  ulong uVar12;
  uint uVar13;
  float fVar14;
  float fVar15;
  undefined4 extraout_XMM0_Db;
  uint extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  bool held;
  bool hovered;
  ImRect column_rect;
  bool local_aa;
  bool local_a9;
  undefined1 local_a8 [16];
  ulong local_98;
  float local_8c;
  ImVec4 local_88;
  ImVec2 local_78;
  ImRect local_70;
  ImGuiContext *local_60;
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 local_48 [16];
  
  pIVar7 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  pIVar3->WriteAccessed = true;
  pIVar4 = (pIVar3->DC).ColumnsSet;
  if (pIVar4 == (ImGuiColumnsSet *)0x0) {
    __assert_fail("columns != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0x31c8,"void ImGui::EndColumns()");
  }
  PopItemWidth();
  PopClipRect();
  ImDrawList::ChannelsMerge(pIVar3->DrawList);
  fVar14 = (pIVar3->DC).CursorPos.y;
  uVar13 = -(uint)(fVar14 <= pIVar4->LineMaxY);
  local_58 = (float)(~uVar13 & (uint)fVar14 | (uint)pIVar4->LineMaxY & uVar13);
  pIVar4->LineMaxY = local_58;
  uStack_54 = 0;
  uStack_50 = 0;
  uStack_4c = 0;
  (pIVar3->DC).CursorPos.y = local_58;
  uVar13 = pIVar4->Flags;
  if ((uVar13 & 0x10) == 0) {
    (pIVar3->DC).CursorMaxPos.x = pIVar4->StartMaxPosX;
  }
  if (((uVar13 & 1) == 0) && (pIVar3->SkipItems == false)) {
    uVar13 = pIVar4->Count;
    iVar9 = -1;
    if (1 < (int)uVar13) {
      local_60 = pIVar7;
      local_8c = pIVar4->StartPosY;
      local_48 = ZEXT416((uint)(local_8c + 1.0));
      local_98 = 0xffffffff;
      uVar12 = 1;
      lVar11 = 0x24;
      do {
        local_a8._0_4_ = (pIVar3->Pos).x;
        fVar14 = GetColumnOffset((int)uVar12);
        local_a8._0_4_ = fVar14 + (float)local_a8._0_4_;
        id = pIVar4->ID + (int)uVar12;
        local_70.Min.x = (float)local_a8._0_4_ + -4.0;
        local_a8._4_4_ = extraout_XMM0_Db;
        local_a8._8_4_ = extraout_XMM0_Dc;
        local_a8._12_4_ = extraout_XMM0_Dd;
        local_70.Max.x = (float)local_a8._0_4_ + 4.0;
        local_70.Min.y = local_8c;
        local_70.Max.y = local_58;
        if (id == GImGui->ActiveId) {
          GImGui->ActiveIdIsAlive = true;
        }
        bVar8 = IsClippedEx(&local_70,id,false);
        if (!bVar8) {
          local_a9 = false;
          local_aa = false;
          if ((pIVar4->Flags & 2) == 0) {
            ButtonBehavior(&local_70,id,&local_a9,&local_aa,0);
            if ((local_a9 != false) || (local_aa == true)) {
              local_60->MouseCursor = 4;
            }
            if (local_aa == true) {
              if ((long)(pIVar4->Columns).Size <= (long)uVar12) goto LAB_00159922;
              if ((*(byte *)((long)&((pIVar4->Columns).Data)->OffsetNorm + lVar11) & 2) == 0) {
                local_98 = uVar12;
              }
              local_98 = local_98 & 0xffffffff;
            }
          }
          iVar9 = (local_a9 & 1) + 0x1b;
          if (local_aa != false) {
            iVar9 = 0x1d;
          }
          puVar1 = (undefined8 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uint)(iVar9 << 4));
          local_88._0_8_ = *puVar1;
          uVar6 = puVar1[1];
          local_88.w = (float)((ulong)uVar6 >> 0x20);
          local_88.z = (float)uVar6;
          local_88.w = (GImGui->Style).Alpha * local_88.w;
          col = ColorConvertFloat4ToU32(&local_88);
          local_78.x = (float)(int)(float)local_a8._0_4_;
          fVar14 = (pIVar3->ClipRect).Min.y;
          uVar13 = -(uint)(fVar14 <= (float)local_48._0_4_);
          local_88.y = (float)(~uVar13 & (uint)fVar14 | uVar13 & local_48._0_4_);
          local_88.x = local_78.x;
          fVar14 = (pIVar3->ClipRect).Max.y;
          local_78.y = local_58;
          if (fVar14 <= local_58) {
            local_78.y = fVar14;
          }
          ImDrawList::AddLine(pIVar3->DrawList,(ImVec2 *)&local_88,&local_78,col,1.0);
        }
        uVar12 = uVar12 + 1;
        uVar13 = pIVar4->Count;
        lVar11 = lVar11 + 0x1c;
      } while ((long)uVar12 < (long)(int)uVar13);
      iVar9 = (int)local_98;
    }
    if (iVar9 != -1) {
      if ((-1 < (int)uVar13) && (pIVar4->IsBeingResized == false)) {
        uVar2 = (pIVar4->Columns).Size;
        uVar10 = 0;
        uVar12 = (ulong)uVar2;
        if ((int)uVar2 < 1) {
          uVar12 = uVar10;
        }
        do {
          if (uVar12 * 0x1c == uVar10) {
LAB_00159922:
            __assert_fail("i < Size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.h"
                          ,0x49a,
                          "value_type &ImVector<ImGuiColumnData>::operator[](int) [T = ImGuiColumnData]"
                         );
          }
          pIVar5 = (pIVar4->Columns).Data;
          *(undefined4 *)((long)&pIVar5->OffsetNormBeforeResize + uVar10) =
               *(undefined4 *)((long)&pIVar5->OffsetNorm + uVar10);
          uVar10 = uVar10 + 0x1c;
        } while ((ulong)uVar13 * 0x1c + 0x1c != uVar10);
      }
      pIVar4->IsBeingResized = true;
      pIVar7 = GImGui;
      if (iVar9 < 1) {
        __assert_fail("column_index > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                      ,0x311a,"float GetDraggedColumnOffset(ImGuiColumnsSet *, int)");
      }
      if (GImGui->ActiveId != pIVar4->ID + iVar9) {
        __assert_fail("g.ActiveId == columns->ID + ImGuiID(column_index)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                      ,0x311b,"float GetDraggedColumnOffset(ImGuiColumnsSet *, int)");
      }
      local_a8 = ZEXT416((uint)((((GImGui->IO).MousePos.x - (GImGui->ActiveIdClickOffset).x) + 4.0)
                               - (GImGui->CurrentWindow->Pos).x));
      fVar14 = GetColumnOffset(iVar9 + -1);
      fVar14 = fVar14 + (pIVar7->Style).ColumnsMinSpacing;
      uVar13 = -(uint)(fVar14 <= (float)local_a8._0_4_);
      fVar14 = (float)(~uVar13 & (uint)fVar14 | local_a8._0_4_ & uVar13);
      if ((pIVar4->Flags & 4) != 0) {
        local_a8._4_4_ = local_a8._4_4_ & extraout_XMM0_Db_00;
        local_a8._0_4_ = fVar14;
        local_a8._8_4_ = local_a8._8_4_ & extraout_XMM0_Dc_00;
        local_a8._12_4_ = local_a8._12_4_ & extraout_XMM0_Dd_00;
        fVar15 = GetColumnOffset(iVar9 + 1);
        fVar15 = fVar15 - (pIVar7->Style).ColumnsMinSpacing;
        fVar14 = (float)local_a8._0_4_;
        if (fVar15 <= (float)local_a8._0_4_) {
          fVar14 = fVar15;
        }
      }
      SetColumnOffset(iVar9,fVar14);
    }
    bVar8 = iVar9 != -1;
  }
  else {
    bVar8 = false;
  }
  pIVar4->IsBeingResized = bVar8;
  (pIVar3->DC).ColumnsSet = (ImGuiColumnsSet *)0x0;
  (pIVar3->DC).ColumnsOffsetX = 0.0;
  (pIVar3->DC).CursorPos.x = (float)(int)((pIVar3->Pos).x + (pIVar3->DC).IndentX + 0.0);
  return;
}

Assistant:

void ImGui::EndColumns()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    ImGuiColumnsSet* columns = window->DC.ColumnsSet;
    IM_ASSERT(columns != NULL);

    PopItemWidth();
    PopClipRect();
    window->DrawList->ChannelsMerge();

    columns->LineMaxY = ImMax(columns->LineMaxY, window->DC.CursorPos.y);
    window->DC.CursorPos.y = columns->LineMaxY;
    if (!(columns->Flags & ImGuiColumnsFlags_GrowParentContentsSize))
        window->DC.CursorMaxPos.x = columns->StartMaxPosX;  // Restore cursor max pos, as columns don't grow parent

    // Draw columns borders and handle resize
    bool is_being_resized = false;
    if (!(columns->Flags & ImGuiColumnsFlags_NoBorder) && !window->SkipItems)
    {
        const float y1 = columns->StartPosY;
        const float y2 = window->DC.CursorPos.y;
        int dragging_column = -1;
        for (int n = 1; n < columns->Count; n++)
        {
            float x = window->Pos.x + GetColumnOffset(n);
            const ImGuiID column_id = columns->ID + ImGuiID(n);
            const float column_hw = GetColumnsRectHalfWidth(); // Half-width for interaction
            const ImRect column_rect(ImVec2(x - column_hw, y1), ImVec2(x + column_hw, y2));
            KeepAliveID(column_id);
            if (IsClippedEx(column_rect, column_id, false))
                continue;
            
            bool hovered = false, held = false;
            if (!(columns->Flags & ImGuiColumnsFlags_NoResize))
            {
                ButtonBehavior(column_rect, column_id, &hovered, &held);
                if (hovered || held)
                    g.MouseCursor = ImGuiMouseCursor_ResizeEW;
                if (held && !(columns->Columns[n].Flags & ImGuiColumnsFlags_NoResize))
                    dragging_column = n;
            }

            // Draw column (we clip the Y boundaries CPU side because very long triangles are mishandled by some GPU drivers.)
            const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : hovered ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
            const float xi = (float)(int)x;
            window->DrawList->AddLine(ImVec2(xi, ImMax(y1 + 1.0f, window->ClipRect.Min.y)), ImVec2(xi, ImMin(y2, window->ClipRect.Max.y)), col);
        }

        // Apply dragging after drawing the column lines, so our rendered lines are in sync with how items were displayed during the frame.
        if (dragging_column != -1)
        {
            if (!columns->IsBeingResized)
                for (int n = 0; n < columns->Count + 1; n++)
                    columns->Columns[n].OffsetNormBeforeResize = columns->Columns[n].OffsetNorm;
            columns->IsBeingResized = is_being_resized = true;
            float x = GetDraggedColumnOffset(columns, dragging_column);
            SetColumnOffset(dragging_column, x);
        }
    }
    columns->IsBeingResized = is_being_resized;

    window->DC.ColumnsSet = NULL;
    window->DC.ColumnsOffsetX = 0.0f;
    window->DC.CursorPos.x = (float)(int)(window->Pos.x + window->DC.IndentX + window->DC.ColumnsOffsetX);
}